

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_jumpRelativeIfTrue
               (sysbvm_bytecodeJit_t *jit,int16_t conditionOperand,size_t targetPC)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  int32_t immediate;
  sysbvm_bytecodeJitPCRelocation_t relocation;
  uint8_t instruction [6];
  
  immediate = 0;
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,conditionOperand);
  sysbvm_jit_x86_cmpRAXWithImmediate32(jit,immediate);
  instruction[4] = '\0';
  instruction[5] = '\0';
  instruction[0] = '\x0f';
  instruction[1] = 0x84;
  instruction[2] = '\0';
  instruction[3] = '\0';
  sVar1 = sysbvm_bytecodeJit_addBytes(jit,6,instruction);
  relocation_00.targetPC = targetPC;
  relocation_00.offset = sVar1 - 4;
  relocation_00.addend = -4;
  sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_jumpRelativeIfTrue(sysbvm_bytecodeJit_t *jit, int16_t conditionOperand, size_t targetPC)
{
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_RAX, conditionOperand);
    sysbvm_jit_x86_cmpRAXWithImmediate32(jit, SYSBVM_TRUE_TUPLE);

    uint8_t instruction[] = {
        // Jeq
        0x0F, 0x84, 0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
    sysbvm_bytecodeJitPCRelocation_t relocation = {
        .offset = relocationOffset,
        .targetPC = targetPC,
        .addend = -4,
    };
    sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
}